

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O3

vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *
xmrig::CudaLib::devices
          (vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__return_storage_ptr__,
          int32_t bfactor,int32_t bsleep,vector<unsigned_int,_std::allocator<unsigned_int>_> *hints)

{
  uint32_t *puVar1;
  uint uVar2;
  uint32_t i;
  uint32_t index;
  const_iterator __begin2;
  uint32_t *puVar3;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *out;
  CudaDevice device;
  CudaDevice local_60;
  
  uVar2 = (*pDeviceCount)();
  if (uVar2 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::reserve
              (__return_storage_ptr__,(ulong)uVar2);
    puVar3 = (hints->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (hints->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar3 == puVar1) {
      index = 0;
      do {
        CudaDevice::CudaDevice(&local_60,index,bfactor,bsleep);
        if (local_60.m_ctx != (nvid_ctx *)0x0) {
          std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::
          emplace_back<xmrig::CudaDevice>(__return_storage_ptr__,&local_60);
        }
        CudaDevice::~CudaDevice(&local_60);
        index = index + 1;
      } while (uVar2 != index);
    }
    else {
      do {
        if (*puVar3 < uVar2) {
          CudaDevice::CudaDevice(&local_60,*puVar3,bfactor,bsleep);
          if (local_60.m_ctx != (nvid_ctx *)0x0) {
            std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::
            emplace_back<xmrig::CudaDevice>(__return_storage_ptr__,&local_60);
          }
          CudaDevice::~CudaDevice(&local_60);
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != puVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::CudaDevice> xmrig::CudaLib::devices(int32_t bfactor, int32_t bsleep, const std::vector<uint32_t> &hints) noexcept
{
    const uint32_t count = deviceCount();
    if (!count) {
        return {};
    }

    std::vector<CudaDevice> out;
    out.reserve(count);

    if (hints.empty()) {
        for (uint32_t i = 0; i < count; ++i) {
            CudaDevice device(i, bfactor, bsleep);
            if (device.isValid()) {
                out.emplace_back(std::move(device));
            }
        }
    }
    else {
        for (const uint32_t i : hints) {
            if (i >= count) {
                continue;
            }

            CudaDevice device(i, bfactor, bsleep);
            if (device.isValid()) {
                out.emplace_back(std::move(device));
            }
        }
    }

    return out;
}